

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  long *plVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  long lVar5;
  undefined8 uVar6;
  char *ctx;
  DrawRend *renderer;
  Viewer viewer;
  vector<CGL::SVG_*,_std::allocator<CGL::SVG_*>_> svgs;
  DrawRend app;
  allocator<char> local_1aa;
  allocator<char> local_1a9;
  long *local_1a8 [2];
  long local_198 [2];
  vector<CGL::SVG_*,_std::allocator<CGL::SVG_*>_> local_188;
  vector<CGL::SVG_*,_std::allocator<CGL::SVG_*>_> local_170;
  long *local_158 [2];
  long local_148 [2];
  long *local_138;
  DrawRend local_130;
  
  if (argc < 2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"[Drawer] ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Not enough arguments. Pass in an .svg or a directory of .svg files.",0x43);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x48);
    std::ostream::put(-0x48);
    std::ostream::flush();
    return 0;
  }
  loadPath(&local_170,argv[1]);
  if (local_170.super__Vector_base<CGL::SVG_*,_std::allocator<CGL::SVG_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_170.super__Vector_base<CGL::SVG_*,_std::allocator<CGL::SVG_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"[Drawer] ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"No svg files successfully loaded. Exiting.",0x2a);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x48);
    std::ostream::put(-0x48);
    std::ostream::flush();
LAB_001651f5:
    if (local_170.super__Vector_base<CGL::SVG_*,_std::allocator<CGL::SVG_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_170.super__Vector_base<CGL::SVG_*,_std::allocator<CGL::SVG_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_170.super__Vector_base<CGL::SVG_*,_std::allocator<CGL::SVG_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_170.super__Vector_base<CGL::SVG_*,_std::allocator<CGL::SVG_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return 0;
  }
  std::vector<CGL::SVG_*,_std::allocator<CGL::SVG_*>_>::vector(&local_188,&local_170);
  CGL::DrawRend::DrawRend(&local_130,&local_188);
  if (local_188.super__Vector_base<CGL::SVG_*,_std::allocator<CGL::SVG_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.super__Vector_base<CGL::SVG_*,_std::allocator<CGL::SVG_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_188.super__Vector_base<CGL::SVG_*,_std::allocator<CGL::SVG_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.super__Vector_base<CGL::SVG_*,_std::allocator<CGL::SVG_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (argc < 5) {
LAB_00165220:
    CGL::Viewer::Viewer((Viewer *)local_1a8);
    renderer = &local_130;
    CGL::Viewer::set_renderer((Viewer *)local_1a8,&renderer->super_Renderer);
    CGL::Viewer::init((Viewer *)local_1a8,(EVP_PKEY_CTX *)renderer);
    CGL::Viewer::start((Viewer *)local_1a8);
    exit(0);
  }
  ctx = "nogl";
  iVar2 = strcmp(argv[2],"nogl");
  if (iVar2 != 0) goto LAB_00165220;
  CGL::DrawRend::init(&local_130,(EVP_PKEY_CTX *)ctx);
  local_130.gl = false;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_1a8,argv[3],&local_1a9);
  plVar1 = local_1a8[0];
  piVar3 = __errno_location();
  iVar2 = *piVar3;
  *piVar3 = 0;
  lVar4 = strtol((char *)plVar1,(char **)local_158,10);
  if (local_158[0] == plVar1) {
    std::__throw_invalid_argument("stoi");
LAB_00165263:
    std::__throw_out_of_range("stoi");
  }
  else {
    if (((int)lVar4 != lVar4) || (*piVar3 == 0x22)) goto LAB_00165263;
    if (*piVar3 == 0) {
      *piVar3 = iVar2;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)local_158,argv[4],&local_1aa);
    plVar1 = local_158[0];
    iVar2 = *piVar3;
    *piVar3 = 0;
    lVar5 = strtol((char *)local_158[0],(char **)&local_138,10);
    if (local_138 != plVar1) {
      if ((0xfffffffeffffffff < lVar5 - 0x80000000U) && (*piVar3 != 0x22)) {
        if (*piVar3 == 0) {
          *piVar3 = iVar2;
        }
        CGL::DrawRend::resize(&local_130,(long)(int)lVar4,(long)(int)lVar5);
        if (local_158[0] != local_148) {
          operator_delete(local_158[0],local_148[0] + 1);
        }
        if (local_1a8[0] != local_198) {
          operator_delete(local_1a8[0],local_198[0] + 1);
        }
        CGL::DrawRend::write_framebuffer(&local_130);
        CGL::DrawRend::~DrawRend(&local_130);
        goto LAB_001651f5;
      }
      goto LAB_0016527b;
    }
  }
  std::__throw_invalid_argument("stoi");
LAB_0016527b:
  uVar6 = std::__throw_out_of_range("stoi");
  CGL::Viewer::~Viewer((Viewer *)local_1a8);
  CGL::DrawRend::~DrawRend(&local_130);
  if (local_170.super__Vector_base<CGL::SVG_*,_std::allocator<CGL::SVG_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_170.super__Vector_base<CGL::SVG_*,_std::allocator<CGL::SVG_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_170.super__Vector_base<CGL::SVG_*,_std::allocator<CGL::SVG_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_170.super__Vector_base<CGL::SVG_*,_std::allocator<CGL::SVG_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  _Unwind_Resume(uVar6);
}

Assistant:

int main( int argc, char** argv ) {

  if (argc < 2) {
    msg("Not enough arguments. Pass in an .svg or a directory of .svg files.");
    return 0;
  }

  vector<SVG*> svgs(loadPath(argv[1]));
  if (svgs.empty()) {
    msg("No svg files successfully loaded. Exiting.");
    return 0;
  }

  // create application
  DrawRend app(svgs);

  if (argc > 4 && strcmp(argv[2],"nogl") == 0) {
    app.init();
    app.set_gl(false);
    app.resize(stoi(argv[3]), stoi(argv[4]));
    app.write_framebuffer();
    return 0;
  }

  // create viewer
  Viewer viewer = Viewer();

  // set renderer
  viewer.set_renderer(&app);

  // init viewer
  viewer.init();

  // start viewer
  viewer.start();

  exit(EXIT_SUCCESS);

  return 0;

}